

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

bool __thiscall duckdb::WriteAheadLogDeserializer::ReplayEntry(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *this_00;
  WALType entry_type;
  
  this_00 = &this->deserializer;
  BinaryDeserializer::OnObjectBegin(this_00);
  entry_type = Deserializer::ReadProperty<duckdb::WALType>
                         (&this_00->super_Deserializer,100,"wal_type");
  if (entry_type != WAL_FLUSH) {
    ReplayEntry(this,entry_type);
  }
  BinaryDeserializer::OnObjectEnd(this_00);
  return entry_type == WAL_FLUSH;
}

Assistant:

bool ReplayEntry() {
		deserializer.Begin();
		auto wal_type = deserializer.ReadProperty<WALType>(100, "wal_type");
		if (wal_type == WALType::WAL_FLUSH) {
			deserializer.End();
			return true;
		}
		ReplayEntry(wal_type);
		deserializer.End();
		return false;
	}